

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

int __thiscall
cmCTestMultiProcessHandler::SearchByName(cmCTestMultiProcessHandler *this,string *name)

{
  pointer __s2;
  _Base_ptr p_Var1;
  _Base_ptr __n;
  int iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_color _Var5;
  
  p_Var3 = (this->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->Properties).
            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var4) {
    _Var5 = ~_S_red;
  }
  else {
    __s2 = (name->_M_dataplus)._M_p;
    p_Var1 = (_Base_ptr)name->_M_string_length;
    _Var5 = ~_S_red;
    do {
      __n = (p_Var3[1]._M_parent)->_M_parent;
      if ((__n == p_Var1) &&
         ((__n == (_Base_ptr)0x0 ||
          (iVar2 = bcmp(*(void **)p_Var3[1]._M_parent,__s2,(size_t)__n), iVar2 == 0)))) {
        _Var5 = p_Var3[1]._M_color;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return _Var5;
}

Assistant:

int cmCTestMultiProcessHandler::SearchByName(std::string const& name)
{
  int index = -1;

  for (PropertiesMap::iterator i = this->Properties.begin();
       i != this->Properties.end(); ++i) {
    if (i->second->Name == name) {
      index = i->first;
    }
  }
  return index;
}